

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O0

Card ** cards_createFromIds(char *idAsString)

{
  unsigned_long uVar1;
  long lVar2;
  char **__ptr;
  Card **id_00;
  Card *pCVar3;
  char *in_RDI;
  Card **cards;
  unsigned_long i;
  char **id;
  char **ids;
  unsigned_long cardCount;
  long local_28;
  char **local_20;
  
  uVar1 = strchrcount(in_RDI,',');
  lVar2 = uVar1 + 1;
  __ptr = strchrexplode(in_RDI,(char)((ulong)lVar2 >> 0x38));
  id_00 = (Card **)malloc(lVar2 << 3);
  local_28 = 0;
  for (local_20 = __ptr; *local_20 != (char *)0x0; local_20 = local_20 + 1) {
    pCVar3 = card_createFromId((char *)id_00);
    id_00[local_28] = pCVar3;
    free(*local_20);
    local_28 = local_28 + 1;
  }
  free(__ptr);
  return id_00;
}

Assistant:

Card ** cards_createFromIds(char * idAsString)
{
	unsigned long cardCount = strchrcount(idAsString, ',')+1;
	char ** ids = strchrexplode(idAsString, ',');
	char ** id;
	unsigned long i;
	Card ** cards = (Card **)malloc(sizeof(Card *)*cardCount);

	for(i=0,id=ids;*id;id++,i++)
	{
		cards[i] = card_createFromId(*id);
		free(*id);
	}
	free(ids);

	return cards;
}